

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error adios2_remove_attribute(adios2_bool *result,adios2_io *io,char *name)

{
  byte bVar1;
  allocator local_59;
  allocator local_58 [32];
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,"for adios2_io, in call to adios2_remove_attribute",local_58);
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)local_58,name,&local_59);
  bVar1 = adios2::core::IO::RemoveAttribute((string *)io);
  *result = (uint)bVar1;
  std::__cxx11::string::~string((string *)local_58);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_remove_attribute(adios2_bool *result, adios2_io *io, const char *name)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_remove_attribute");
        *result = reinterpret_cast<adios2::core::IO *>(io)->RemoveAttribute(name) ? adios2_true
                                                                                  : adios2_false;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_remove_attribute"));
    }
}